

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cc
# Opt level: O1

int unfinished_tasks_test(TestArgsBase *TEST_args_base__)

{
  int __how;
  int __fd;
  pointer pcVar1;
  ThreadPoolOptions opt;
  mutex mm;
  ThreadPoolMgr mgr;
  undefined1 local_2a8 [16];
  undefined1 local_298 [24];
  undefined1 local_280 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_268;
  undefined1 local_260 [16];
  pointer local_250;
  undefined1 local_248 [9];
  bool bStack_23f;
  undefined1 local_238 [16];
  undefined1 local_228 [24];
  ThreadPoolMgr local_210;
  
  __fd = (int)local_2a8;
  local_248._0_8_ = 100;
  local_250 = TEST_args_base__[1].testName._M_dataplus._M_p;
  bStack_23f = true;
  local_248[8] = *(bool *)&TEST_args_base__[1]._vptr_TestArgsBase;
  simple_thread_pool::ThreadPoolMgr::ThreadPoolMgr((ThreadPoolMgr *)(local_228 + 0x18));
  simple_thread_pool::ThreadPoolMgr::init
            ((ThreadPoolMgr *)(local_228 + 0x18),(EVP_PKEY_CTX *)&local_250);
  TestSuite::_msgt("begin\n");
  local_228._0_8_ = 0;
  local_228._8_8_ = 0;
  local_238._0_8_ = 0;
  local_238._8_8_ = 0;
  local_228._16_8_ = 0;
  pcVar1 = (pointer)0x0;
  do {
    local_298._8_8_ =
         std::
         _Function_handler<void_(const_simple_thread_pool::TaskResult_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]simple_thread_pool/tests/basic_test.cc:328:22)>
         ::_M_invoke;
    local_298._0_8_ =
         std::
         _Function_handler<void_(const_simple_thread_pool::TaskResult_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]simple_thread_pool/tests/basic_test.cc:328:22)>
         ::_M_manager;
    local_2a8._0_8_ = pcVar1;
    local_2a8._8_8_ = local_238;
    simple_thread_pool::ThreadPoolMgr::addTask
              ((ThreadPoolMgr *)local_260,(TaskHandler *)(local_228 + 0x18),(uint64_t)local_2a8,
               ONE_TIME);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._8_8_);
    }
    if ((code *)local_298._0_8_ != (code *)0x0) {
      (*(code *)local_298._0_8_)(local_2a8,local_2a8,3);
    }
    pcVar1 = pcVar1 + 1;
  } while (pcVar1 != (pointer)0xf);
  local_2a8._0_8_ = (pointer)0x0;
  local_2a8._8_8_ = 0;
  local_298._8_8_ =
       std::
       _Function_handler<void_(const_simple_thread_pool::TaskResult_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]simple_thread_pool/tests/basic_test.cc:339:18)>
       ::_M_invoke;
  local_298._0_8_ =
       std::
       _Function_handler<void_(const_simple_thread_pool::TaskResult_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]simple_thread_pool/tests/basic_test.cc:339:18)>
       ::_M_manager;
  simple_thread_pool::ThreadPoolMgr::addTask
            ((ThreadPoolMgr *)(local_280 + 0x10),(TaskHandler *)(local_228 + 0x18),
             (uint64_t)local_2a8,20000);
  if (local_268 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_268);
  }
  if ((code *)local_298._0_8_ != (code *)0x0) {
    (*(code *)local_298._0_8_)(local_2a8,local_2a8,3);
  }
  local_2a8._0_8_ = (pointer)0x0;
  local_2a8._8_8_ = 0;
  local_298._8_8_ =
       std::
       _Function_handler<void_(const_simple_thread_pool::TaskResult_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]simple_thread_pool/tests/basic_test.cc:347:18)>
       ::_M_invoke;
  local_298._0_8_ =
       std::
       _Function_handler<void_(const_simple_thread_pool::TaskResult_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]simple_thread_pool/tests/basic_test.cc:347:18)>
       ::_M_manager;
  simple_thread_pool::ThreadPoolMgr::addTask
            ((ThreadPoolMgr *)local_280,(TaskHandler *)(local_228 + 0x18),(uint64_t)local_2a8,500000
            );
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280._8_8_);
  }
  if ((code *)local_298._0_8_ != (code *)0x0) {
    (*(code *)local_298._0_8_)(local_2a8,local_2a8,3);
  }
  local_2a8._8_8_ = 0;
  local_298._0_8_ = local_298._0_8_ & 0xffffffffffffff00;
  local_2a8._0_8_ = local_298;
  TestSuite::sleep_ms(0x32,(string *)local_2a8);
  if ((undefined1 *)local_2a8._0_8_ != local_298) {
    operator_delete((void *)local_2a8._0_8_);
  }
  TestSuite::_msgt("shutdown thread pool\n");
  simple_thread_pool::ThreadPoolMgr::shutdown((ThreadPoolMgr *)(local_228 + 0x18),__fd,__how);
  simple_thread_pool::ThreadPoolMgr::~ThreadPoolMgr((ThreadPoolMgr *)(local_228 + 0x18));
  return 0;
}

Assistant:

int unfinished_tasks_test(PARAM_BASE) {
    GET_PARAMS(unfinished_tasks_test_params);

    ThreadPoolOptions opt;
    opt.numInitialThreads = unfinished_tasks_test_params->num_threads;
    opt.invokeCanceledTask = unfinished_tasks_test_params->cancel_flag;

    // Initialize thread pool.
    ThreadPoolMgr mgr;
    mgr.init(opt);

    TestSuite::_msgt("begin\n");

    std::mutex mm;

    // 15 async tasks.
    for (size_t ii=0; ii<15; ++ii) {
        mgr.addTask( [ii, &mm](const TaskResult& ret) {
            std::lock_guard<std::mutex> l(mm);
            TestSuite::_msgt("[%02zx] async task %zu, result %d\n",
                             tid_simple(), ii, ret);
            if (ret.ok()) {
                TestSuite::sleep_ms(10);
            }
        } );
    }

    // Recurring timer whose interval is 20 ms.
    mgr.addTask( [](const TaskResult& ret) {
                     TestSuite::_msgt("[%02zx] recurring 20 ms, result %d\n",
                                      tid_simple(), ret);
                 },
                 20*1000,
                 TaskType::RECURRING );

    // One-time timer whose interval is 500 ms.
    mgr.addTask( [](const TaskResult& ret) {
                     TestSuite::_msgt("[%02zx] one-time 500 ms, result %d\n",
                                      tid_simple(), ret);
                 },
                 500000 );

    // Wait 50 ms.
    TestSuite::sleep_ms(50);

    // Shutdown thread pool.
    // If `opt.invokeCanceledTask = true`, unfinished tasks will be fired
    // with `CANCELED` result code. Otherwise, they will be just purged.
    TestSuite::_msgt("shutdown thread pool\n");
    mgr.shutdown();

    return 0;
}